

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EPoller.cpp
# Opt level: O3

void __thiscall mario::EPoller::~EPoller(EPoller *this)

{
  pointer peVar1;
  
  close(this->_epollfd);
  std::
  _Rb_tree<int,_std::pair<const_int,_mario::Channel_*>,_std::_Select1st<std::pair<const_int,_mario::Channel_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_mario::Channel_*>_>_>
  ::~_Rb_tree(&(this->_channels)._M_t);
  peVar1 = (this->_events).super__Vector_base<epoll_event,_std::allocator<epoll_event>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (peVar1 != (pointer)0x0) {
    operator_delete(peVar1);
    return;
  }
  return;
}

Assistant:

EPoller::~EPoller() {
    ::close(_epollfd);
}